

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall t_swift_generator::generate_old_enum(t_swift_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  reference pptVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_78;
  t_enum_value **local_70;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_68;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_38;
  t_enum *local_18;
  t_enum *tenum_local;
  t_swift_generator *this_local;
  
  local_18 = tenum;
  tenum_local = (t_enum *)this;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_38);
  poVar3 = std::operator<<(poVar3,"public enum ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar3," : Int32");
  std::__cxx11::string::~string((string *)&local_38);
  block_open(this,(ostream *)&this->f_decl_);
  __x = t_enum::get_constants(local_18);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_68);
  local_70 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_68._M_current = local_70;
  while( true ) {
    local_78._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_68,&local_78);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,"case ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_68);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    poVar3 = std::operator<<(poVar3," = ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_68);
    iVar2 = t_enum_value::get_value(*pptVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_68);
  }
  std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_b8);
  poVar3 = std::operator<<(poVar3,"public init() { self.init(rawValue: ");
  pptVar6 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::front
                      ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  iVar2 = t_enum_value::get_value(*pptVar6);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,")! }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  block_close(this,(ostream *)&this->f_decl_,true);
  std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_impl_,(string *)&local_d8);
  poVar3 = std::operator<<(poVar3,"extension ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  std::operator<<(poVar3," : TEnum");
  std::__cxx11::string::~string((string *)&local_d8);
  block_open(this,(ostream *)&this->f_impl_);
  std::operator<<((ostream *)&this->f_impl_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_impl_,(string *)&local_f8);
  poVar3 = std::operator<<(poVar3,
                           "public static func readValueFromProtocol(proto: TProtocol) throws -> ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
  std::__cxx11::string::~string((string *)&local_f8);
  block_open(this,(ostream *)&this->f_impl_);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_impl_,(string *)&local_118);
  poVar3 = std::operator<<(poVar3,"var raw = Int32()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_138);
  poVar3 = std::operator<<(poVar3,"try proto.readI32(&raw)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_158);
  poVar3 = std::operator<<(poVar3,"return ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar2));
  poVar3 = std::operator<<(poVar3,"(rawValue: raw)!");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  block_close(this,(ostream *)&this->f_impl_,true);
  std::operator<<((ostream *)&this->f_impl_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_impl_,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"public static func writeValue(value: ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_03,iVar2));
  std::operator<<(poVar3,", toProtocol proto: TProtocol) throws");
  std::__cxx11::string::~string((string *)&local_178);
  block_open(this,(ostream *)&this->f_impl_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_impl_,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"try proto.writeI32(value.rawValue)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  block_close(this,(ostream *)&this->f_impl_,true);
  std::operator<<((ostream *)&this->f_impl_,(string *)&::endl_abi_cxx11_);
  block_close(this,(ostream *)&this->f_impl_,true);
  std::operator<<((ostream *)&this->f_impl_,(string *)&::endl_abi_cxx11_);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  return;
}

Assistant:

void t_swift_generator::generate_old_enum(t_enum* tenum) {
  f_decl_ << indent() << "public enum " << tenum->get_name() << " : Int32";
  block_open(f_decl_);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;

  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << (*c_iter)->get_name()
            << " = " << (*c_iter)->get_value() << endl;
  }

  f_decl_ << endl;
  f_decl_ << indent() << "public init() { self.init(rawValue: " << constants.front()->get_value() << ")! }" << endl;

  block_close(f_decl_);
  f_decl_ << endl;

  f_impl_ << indent() << "extension " << tenum->get_name() << " : TEnum";
  block_open(f_impl_);

  f_impl_ << endl;

  f_impl_ << indent() << "public static func readValueFromProtocol(proto: TProtocol) throws -> " << tenum->get_name();
  block_open(f_impl_);
  f_impl_ << indent() << "var raw = Int32()" << endl
          << indent() << "try proto.readI32(&raw)" << endl
          << indent() << "return " << tenum->get_name() << "(rawValue: raw)!" << endl;
  block_close(f_impl_);
  f_impl_ << endl;

  f_impl_ << indent() << "public static func writeValue(value: " << tenum->get_name() << ", toProtocol proto: TProtocol) throws";
  block_open(f_impl_);
  f_impl_ << indent() << "try proto.writeI32(value.rawValue)" << endl;
  block_close(f_impl_);
  f_impl_ << endl;

  block_close(f_impl_);
  f_impl_ << endl;
}